

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  bool bVar1;
  pointer this_00;
  size_type sVar2;
  ostream *poVar3;
  long in_RSI;
  long lVar4;
  double in_RDI;
  long in_FS_OFFSET;
  double dur;
  Colour colour;
  undefined4 in_stack_ffffffffffffff58;
  Code in_stack_ffffffffffffff5c;
  ConsoleReporter *in_stack_ffffffffffffff60;
  IConfig *in_stack_ffffffffffffff68;
  string local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = in_RSI;
  this_00 = clara::std::unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>::
            operator->((unique_ptr<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_> *
                       )0x24e1c8);
  TablePrinter::close(this_00,(int)lVar4);
  if ((*(byte *)(in_RSI + 0x78) & 1) != 0) {
    lazyPrint(in_stack_ffffffffffffff60);
    Colour::Colour((Colour *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    sVar2 = clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::size
                      ((vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_> *)
                       ((long)in_RDI + 0x148));
    if (sVar2 < 2) {
      std::operator<<(*(ostream **)((long)in_RDI + 0x18),"\nNo assertions in test case");
    }
    else {
      std::operator<<(*(ostream **)((long)in_RDI + 0x18),"\nNo assertions in section");
    }
    poVar3 = std::operator<<(*(ostream **)((long)in_RDI + 0x18)," \'");
    poVar3 = std::operator<<(poVar3,(string *)(in_RSI + 8));
    poVar3 = std::operator<<(poVar3,"\'\n");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    Colour::~Colour((Colour *)0x24e2c9);
  }
  clara::std::__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*((__shared_ptr_access<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
            in_stack_ffffffffffffff60);
  bVar1 = shouldShowDuration(in_stack_ffffffffffffff68,(double)in_stack_ffffffffffffff60);
  if (bVar1) {
    poVar3 = *(ostream **)((long)in_RDI + 0x18);
    getFormattedDuration_abi_cxx11_(in_RDI);
    poVar3 = std::operator<<(poVar3,local_28);
    poVar3 = std::operator<<(poVar3," s: ");
    in_stack_ffffffffffffff60 = (ConsoleReporter *)std::operator<<(poVar3,(string *)(in_RSI + 8));
    std::ostream::operator<<(in_stack_ffffffffffffff60,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_28);
  }
  if ((*(byte *)((long)in_RDI + 0x170) & 1) != 0) {
    *(undefined1 *)((long)in_RDI + 0x170) = 0;
  }
  StreamingReporterBase<Catch::ConsoleReporter>::sectionEnded
            (&in_stack_ffffffffffffff60->super_StreamingReporterBase<Catch::ConsoleReporter>,
             (SectionStats *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        Colour colour(Colour::ResultError);
        if (m_sectionStack.size() > 1)
            stream << "\nNo assertions in section";
        else
            stream << "\nNo assertions in test case";
        stream << " '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << std::endl;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}